

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O0

executor_op<asio::detail::executor_function_view,_std::allocator<void>,_asio::detail::scheduler_operation>
* __thiscall
asio::detail::
recycling_allocator<asio::detail::executor_op<asio::detail::executor_function_view,_std::allocator<void>,_asio::detail::scheduler_operation>,_asio::detail::thread_info_base::default_tag>
::allocate(recycling_allocator<asio::detail::executor_op<asio::detail::executor_function_view,_std::allocator<void>,_asio::detail::scheduler_operation>,_asio::detail::thread_info_base::default_tag>
           *this,size_t n)

{
  thread_info_base *ptVar1;
  executor_op<asio::detail::executor_function_view,_std::allocator<void>,_asio::detail::scheduler_operation>
  *peVar2;
  long in_RSI;
  void *p;
  
  ptVar1 = thread_context::top_of_thread_call_stack();
  peVar2 = (executor_op<asio::detail::executor_function_view,_std::allocator<void>,_asio::detail::scheduler_operation>
            *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (ptVar1,in_RSI * 0x30,8);
  return peVar2;
}

Assistant:

T* allocate(std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = thread_info_base::allocate(Purpose(),
        thread_context::top_of_thread_call_stack(),
        sizeof(T) * n, alignof(T));
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = asio::aligned_new(align, s);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    return static_cast<T*>(p);
  }